

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryEntry.h
# Opt level: O1

bool __thiscall
JsUtil::
CacheHashedEntry<Memory::WriteBarrierPtr<Js::JavascriptString>,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,JsUtil::(anonymous_namespace)::KeyValueEntry>
::KeyEquals<Js::PropertyRecordStringHashComparer<Js::JavascriptString*>,Js::JavascriptString*>
          (CacheHashedEntry<Memory::WriteBarrierPtr<Js::JavascriptString>,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,JsUtil::(anonymous_namespace)::KeyValueEntry>
           *this,JavascriptString **otherKey,hash_t otherHashCode)

{
  JavascriptString *pJVar1;
  JavascriptString *this_00;
  code *pcVar2;
  bool bVar3;
  charcount_t cVar4;
  int iVar5;
  charcount_t cVar6;
  char16 *pcVar7;
  undefined4 *puVar8;
  char16 *string2;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  
  pJVar1 = *(JavascriptString **)(this + 8);
  pcVar7 = Js::JavascriptString::GetString(pJVar1);
  cVar4 = Js::JavascriptString::GetLength(pJVar1);
  if (cVar4 == 0) {
    iVar5 = 0x2393b8b;
  }
  else {
    uVar10 = 0x811c9dc5;
    uVar9 = 0;
    do {
      uVar11 = (ushort)pcVar7[uVar9] ^ uVar10;
      uVar10 = uVar11 * 0x1000193;
      uVar9 = uVar9 + 1;
    } while (cVar4 != uVar9);
    iVar5 = uVar11 * 0x2000326 + 1;
  }
  if (iVar5 != *(int *)(this + 0x10)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DictionaryEntry.h"
                       ,199,
                       "(((static_cast<hash_t>(Comparer::GetHashCode(this->Key())) << 1) | 1) == this->hashCode)"
                       ,"TAGHASH(Comparer::GetHashCode(this->Key())) == this->hashCode");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar8 = 0;
  }
  if (*(hash_t *)(this + 0x10) == otherHashCode) {
    pJVar1 = *(JavascriptString **)(this + 8);
    this_00 = *otherKey;
    cVar4 = Js::JavascriptString::GetLength(pJVar1);
    cVar6 = Js::JavascriptString::GetLength(this_00);
    if (cVar4 == cVar6) {
      pcVar7 = Js::JavascriptString::GetString(pJVar1);
      string2 = Js::JavascriptString::GetString(this_00);
      cVar4 = Js::JavascriptString::GetLength(pJVar1);
      if (pcVar7 != string2) {
        iVar5 = PAL_wmemcmp(pcVar7,string2,(ulong)cVar4);
        return iVar5 == 0;
      }
      return true;
    }
  }
  return false;
}

Assistant:

inline bool KeyEquals(TLookup const& otherKey, hash_t otherHashCode)
        {
            Assert(TAGHASH(Comparer::GetHashCode(this->Key())) == this->hashCode);
            return this->hashCode == otherHashCode && Comparer::Equals(this->Key(), otherKey);
        }